

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_tab.c
# Opt level: O0

void lj_tab_clear(GCtab *t)

{
  uint uVar1;
  uint64_t uVar2;
  undefined8 *puVar3;
  Node *node;
  GCtab *t_local;
  TValue *array;
  uint32_t asize;
  uint32_t i;
  Node *n;
  Node *node_1;
  uint32_t hmask;
  uint32_t i_1;
  
  uVar1 = t->asize;
  uVar2 = (t->array).ptr64;
  for (array._4_4_ = 0; array._4_4_ < uVar1; array._4_4_ = array._4_4_ + 1) {
    *(undefined8 *)(uVar2 + (ulong)array._4_4_ * 8) = 0xffffffffffffffff;
  }
  if (t->hmask != 0) {
    (t->freetop).ptr64 = (t->node).ptr64 + (ulong)(t->hmask + 1) * 0x18;
    uVar1 = t->hmask;
    uVar2 = (t->node).ptr64;
    for (node_1._4_4_ = 0; node_1._4_4_ <= uVar1; node_1._4_4_ = node_1._4_4_ + 1) {
      puVar3 = (undefined8 *)(uVar2 + (ulong)node_1._4_4_ * 0x18);
      puVar3[2] = 0;
      puVar3[1] = 0xffffffffffffffff;
      *puVar3 = 0xffffffffffffffff;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_tab_clear(GCtab *t)
{
  clearapart(t);
  if (t->hmask > 0) {
    Node *node = noderef(t->node);
    setfreetop(t, node, &node[t->hmask+1]);
    clearhpart(t);
  }
}